

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void ReturnResponseThread<signed_char>
               (CMConnection conn,CMFormat ReadResponseFormat,AnonADIOSFile *f,size_t readSize,
               char *RawData,void *Dest,int GetResponseCondition,Accuracy acc,string *name,
               DataType vartype,size_t stepStart,size_t stepCount,Dims *count,Dims *start,
               size_t blockid,bool boxselection)

{
  bool bVar1;
  ostream *poVar2;
  ulong local_78;
  void *pvStack_70;
  undefined8 local_68;
  size_t local_60;
  char *local_58;
  string local_50;
  
  bVar1 = boxselection;
  local_78 = (ulong)(uint)GetResponseCondition;
  local_68 = 0x7f;
  pvStack_70 = Dest;
  local_60 = readSize;
  local_58 = RawData;
  if (1 < verbose) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Returning ");
    if (bVar1) {
      readable_size_abi_cxx11_(&local_50,readSize);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      poVar2 = std::operator<<(poVar2," for Get<");
      poVar2 = adios2::operator<<(poVar2,&vartype);
      poVar2 = std::operator<<(poVar2,">(");
      poVar2 = std::operator<<(poVar2,(string *)name);
      poVar2 = std::operator<<(poVar2,") start = ");
      poVar2 = adios2::operator<<(poVar2,start);
      poVar2 = std::operator<<(poVar2," count = ");
      poVar2 = adios2::operator<<(poVar2,count);
      poVar2 = std::operator<<(poVar2," steps = ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,"..");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    else {
      readable_size_abi_cxx11_(&local_50,readSize);
      poVar2 = std::operator<<(poVar2,(string *)&local_50);
      poVar2 = std::operator<<(poVar2," for Get<");
      poVar2 = adios2::operator<<(poVar2,&vartype);
      poVar2 = std::operator<<(poVar2,">(");
      poVar2 = std::operator<<(poVar2,(string *)name);
      poVar2 = std::operator<<(poVar2,") block = ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  CMwrite(conn,ReadResponseFormat,&local_78);
  free(local_58);
  std::mutex::lock(&mutex_nThreads);
  f->m_BytesSent = local_60 + f->m_BytesSent;
  f->m_OperationCount = f->m_OperationCount + 1;
  TotalGetBytesSent = TotalGetBytesSent + local_60;
  TotalGets = TotalGets + 1;
  nThreads = nThreads - 1;
  pthread_mutex_unlock((pthread_mutex_t *)&mutex_nThreads);
  return;
}

Assistant:

void ReturnResponseThread(CMConnection conn, CMFormat ReadResponseFormat, AnonADIOSFile *f,
                          size_t readSize, T *RawData, void *Dest, int GetResponseCondition,
                          Accuracy acc, std::string name, adios2::DataType vartype,
                          size_t stepStart, size_t stepCount, adios2::Dims count,
                          adios2::Dims start, size_t blockid, bool boxselection)

{
    _ReadResponseMsg Response;
    memset(&Response, 0, sizeof(Response));
    Response.Size = readSize;
    Response.ReadResponseCondition = GetResponseCondition;
    Response.Dest = Dest; /* final data destination in client memory space */
    Response.OperatorType = Operator::OperatorType::COMPRESS_NULL;

    if (acc.error > 0.0)
    {
#if defined(ADIOS2_HAVE_MGARD) || defined(ADIOS2_HAVE_ZFP)
#if defined(ADIOS2_HAVE_MGARD)
        Params p = {{"accuracy", std::to_string(acc.error)},
                    {"s", std::to_string(acc.norm)},
                    {"mode", (acc.relative ? "REL" : "ABS")}};
        auto op = MakeOperator("mgard", p);
#elif defined(ADIOS2_HAVE_ZFP)
        Params p = {{"accuracy", std::to_string(acc.error)}};
        auto op = MakeOperator("zfp", p);
#endif
        // TODO: would be nicer:
        // op.SetAccuracy(Accuracy(GetMsg->error, GetMsg->norm, GetMsg->relative));
        T *CompressedData = (T *)malloc(Response.Size);
        adios2::Dims c;
        if (stepCount <= 1)
        {
            c = count;
        }
        else
        {
            c = helper::DimsWithStep(stepCount, count);
        }
        size_t result = op->Operate((char *)RawData, {}, c, vartype, (char *)CompressedData);
        if (result == 0)
        {
            Response.ReadData = (char *)RawData;
            free(CompressedData);
        }
        else
        {
            Response.ReadData = (char *)CompressedData;
            Response.Size = result;
            Response.OperatorType = op->m_TypeEnum;
            free(RawData);
        }
#else
        Response.ReadData = (char *)RawData;
#endif
    }
    else
    {
        Response.ReadData = (char *)RawData;
    }

    if (verbose >= 2)
    {
        if (boxselection)
        {
            std::cout << "Returning " << readable_size(Response.Size) << " for Get<" << vartype
                      << ">(" << name << ") start = " << start << " count = " << count
                      << " steps = " << stepStart << ".." << stepStart + stepCount - 1 << std::endl;
        }
        else
        {
            std::cout << "Returning " << readable_size(Response.Size) << " for Get<" << vartype
                      << ">(" << name << ") block = " << blockid << std::endl;
        }
    }
    // std::cout << "-- start sending response --" << std::endl;
    CMwrite(conn, ReadResponseFormat, &Response);
    free(Response.ReadData);
    // std::cout << "-- sent response --" << std::endl;
    {
        // std::cout << "-- get lock --" << std::endl;
        std::lock_guard<std::mutex> lockGuard(mutex_nThreads);
        // std::cout << "-- lock acquired --" << std::endl;
        f->m_BytesSent += Response.Size;
        f->m_OperationCount++;
        TotalGetBytesSent += Response.Size;
        TotalGets++;
        --nThreads;
    }
    // std::cout << "-- done --" << std::endl;
}